

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BCD.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     daas<true,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (uint8_t *al,Context *context)

{
  byte bVar1;
  byte value;
  byte bVar2;
  bool bVar3;
  
  bVar1 = *al;
  bVar3 = (context->flags).auxiliary_carry_ != 0;
  bVar2 = 0x99;
  if (bVar3) {
    bVar2 = 0x9f;
  }
  value = bVar1;
  if (9 < (bVar1 & 0xe) || bVar3) {
    *al = bVar1 + 6;
    (context->flags).auxiliary_carry_ = 1;
    value = *al;
  }
  if ((bVar2 < bVar1) || ((context->flags).carry_ != 0)) {
    *al = value + 0x60;
    (context->flags).carry_ = 1;
    value = *al;
  }
  Flags::
  set_from<unsigned_char,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)8>
            (&context->flags,value);
  return;
}

Assistant:

void daas(
	uint8_t &al,
	ContextT &context
) {
	bool top_exceeded_threshold;
	if constexpr (ContextT::model == Model::i8086) {
		top_exceeded_threshold = al > (context.flags.template flag<Flag::AuxiliaryCarry>() ? 0x9f : 0x99);
	} else {
		top_exceeded_threshold = al > 0x99;
	}

	if((al & 0x0f) > 0x09 || context.flags.template flag<Flag::AuxiliaryCarry>()) {
		if constexpr (add) al += 0x06; else al -= 0x06;
		context.flags.template set_from<Flag::AuxiliaryCarry>(1);
	}

	if(top_exceeded_threshold || context.flags.template flag<Flag::Carry>()) {
		if constexpr (add) al += 0x60; else al -= 0x60;
		context.flags.template set_from<Flag::Carry>(1);
	}

	context.flags.template set_from<uint8_t, Flag::Zero, Flag::Sign, Flag::ParityOdd>(al);
}